

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

void deallocateVecOfIntVec(Vec_Ptr_t *vecOfIntVec)

{
  void *__ptr;
  long lVar1;
  
  if (vecOfIntVec != (Vec_Ptr_t *)0x0) {
    if (0 < vecOfIntVec->nSize) {
      lVar1 = 0;
      do {
        __ptr = vecOfIntVec->pArray[lVar1];
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < vecOfIntVec->nSize);
    }
    if (vecOfIntVec->pArray != (void **)0x0) {
      free(vecOfIntVec->pArray);
      vecOfIntVec->pArray = (void **)0x0;
    }
    free(vecOfIntVec);
    return;
  }
  return;
}

Assistant:

void deallocateVecOfIntVec( Vec_Ptr_t *vecOfIntVec )
{
    Vec_Int_t *vInt;
    int i;

    if( vecOfIntVec )
    {
        Vec_PtrForEachEntry( Vec_Int_t *, vecOfIntVec, vInt, i )
        {
            Vec_IntFree( vInt );
        }
        Vec_PtrFree(vecOfIntVec);
    }    
}